

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O1

void binbuf_addv(_binbuf *x,char *fmt,...)

{
  byte bVar1;
  char in_AL;
  uint uVar2;
  ulong uVar3;
  undefined8 in_RCX;
  ulong uVar4;
  undefined8 in_RDX;
  double *pdVar5;
  undefined8 in_R8;
  void **ppvVar6;
  void **ppvVar7;
  void **ppvVar8;
  undefined8 in_R9;
  long lVar9;
  undefined4 in_XMM0_Da;
  float fVar10;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  t_atom arg [100];
  void *local_708 [4];
  undefined8 local_6e8;
  undefined8 local_6e0;
  undefined4 local_6d8;
  undefined8 local_6c8;
  undefined8 local_6b8;
  undefined8 local_6a8;
  undefined8 local_698;
  undefined8 local_688;
  undefined8 local_678;
  undefined8 local_668;
  t_atom local_658 [100];
  
  local_708[2] = (void *)in_RDX;
  local_708[3] = (void *)in_RCX;
  local_6e8 = in_R8;
  local_6e0 = in_R9;
  if (in_AL != '\0') {
    local_6d8 = in_XMM0_Da;
    local_6c8 = in_XMM1_Qa;
    local_6b8 = in_XMM2_Qa;
    local_6a8 = in_XMM3_Qa;
    local_698 = in_XMM4_Qa;
    local_688 = in_XMM5_Qa;
    local_678 = in_XMM6_Qa;
    local_668 = in_XMM7_Qa;
  }
  ppvVar8 = &ap[0].overflow_arg_area;
  uVar3 = 0x10;
  uVar4 = 0x30;
  pdVar5 = (double *)((long)local_658 + 8);
  lVar9 = 0;
  do {
    bVar1 = fmt[lVar9];
    if (bVar1 < 0x66) {
      if (bVar1 == 0x2c) {
        *(undefined4 *)(pdVar5 + -1) = 5;
      }
      else {
        if (bVar1 != 0x3b) goto LAB_00169228;
        *(undefined4 *)(pdVar5 + -1) = 4;
      }
      *(undefined4 *)pdVar5 = 0;
    }
    else {
      if (bVar1 == 0x66) {
        *(undefined4 *)(pdVar5 + -1) = 1;
        if ((uint)uVar4 < 0xa1) {
          ppvVar6 = (void **)((long)local_708 + uVar4);
          uVar4 = (ulong)((uint)uVar4 + 0x10);
        }
        else {
          ppvVar6 = ppvVar8;
          ppvVar8 = ppvVar8 + 1;
        }
        fVar10 = (float)(double)*ppvVar6;
      }
      else {
        uVar2 = (uint)uVar3;
        if (bVar1 == 0x73) {
          *(undefined4 *)(pdVar5 + -1) = 2;
          if (uVar2 < 0x29) {
            ppvVar6 = (void **)((long)local_708 + uVar3);
            uVar3 = (ulong)(uVar2 + 8);
          }
          else {
            ppvVar6 = ppvVar8;
            ppvVar8 = ppvVar8 + 1;
          }
          *pdVar5 = (double)*ppvVar6;
          goto LAB_001691fc;
        }
        if (bVar1 != 0x69) goto LAB_00169228;
        *(undefined4 *)(pdVar5 + -1) = 1;
        if (uVar2 < 0x29) {
          ppvVar7 = (void **)((long)local_708 + uVar3);
          uVar3 = (ulong)(uVar2 + 8);
          ppvVar6 = ppvVar8;
        }
        else {
          ppvVar6 = ppvVar8 + 1;
          ppvVar7 = ppvVar8;
        }
        fVar10 = (float)*(int *)ppvVar7;
        ppvVar8 = ppvVar6;
      }
      *(float *)pdVar5 = fVar10;
    }
LAB_001691fc:
    lVar9 = lVar9 + 1;
    pdVar5 = pdVar5 + 2;
  } while ((int)lVar9 != 100);
  lVar9 = 100;
  pd_error((void *)0x0,"binbuf_addmessv: only %d allowed",100);
LAB_00169228:
  binbuf_add(x,(int)lVar9,local_658);
  return;
}

Assistant:

void binbuf_addv(t_binbuf *x, const char *fmt, ...)
{
    va_list ap;
    t_atom arg[MAXADDMESSV], *at =arg;
    int nargs = 0;
    const char *fp = fmt;

    va_start(ap, fmt);
    while (1)
    {
        if (nargs >= MAXADDMESSV)
        {
            pd_error(0, "binbuf_addmessv: only %d allowed", MAXADDMESSV);
            break;
        }
        switch(*fp++)
        {
        case 'i': SETFLOAT(at, va_arg(ap, int)); break;
        case 'f': SETFLOAT(at, va_arg(ap, double)); break;
        case 's': SETSYMBOL(at, va_arg(ap, t_symbol *)); break;
        case ';': SETSEMI(at); break;
        case ',': SETCOMMA(at); break;
        default: goto done;
        }
        at++;
        nargs++;
    }
done:
    va_end(ap);
    binbuf_add(x, nargs, arg);
}